

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O3

data_ptr_t __thiscall duckdb::MetadataReader::BasePtr(MetadataReader *this)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  BlockManager *pBVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->block).handle.node);
  pdVar1 = ((this->block).handle.node.ptr)->buffer;
  iVar2 = this->index;
  pBVar3 = this->manager->block_manager;
  iVar4 = optional_idx::GetIndex(&pBVar3->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar3->block_header_size);
  return pdVar1 + (iVar4 - iVar5 >> 6 & 0xfffffffffffffff8) * iVar2;
}

Assistant:

data_ptr_t MetadataReader::BasePtr() {
	return block.handle.Ptr() + index * GetMetadataManager().GetMetadataBlockSize();
}